

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O3

bool __thiscall
libtorrent::anon_unknown_6::ut_pex_peer_plugin::on_extended
          (ut_pex_peer_plugin *this,int length,int msg,span<const_char> body)

{
  byte bVar1;
  pointer ppVar2;
  pointer ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  rep rVar6;
  rep rVar7;
  rep rVar8;
  rep rVar9;
  undefined1 auVar10 [8];
  pointer pbVar11;
  anon_union_16_3_a3f0114d_for___in6_u aVar12;
  bool bVar13;
  int iVar14;
  type_t tVar15;
  int iVar16;
  torrent_flags_t tVar17;
  _func_int **pp_Var18;
  time_point tVar19;
  __normal_iterator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>_>
  _Var20;
  session_settings *psVar21;
  short *psVar22;
  __normal_iterator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_*,_std::vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>_>
  _Var23;
  ulong uVar24;
  undefined4 extraout_var_00;
  undefined8 uVar25;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **extraout_RDX_01;
  char **extraout_RDX_02;
  char **extraout_RDX_03;
  char **extraout_RDX_04;
  char **extraout_RDX_05;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *extraout_RDX_06;
  pair<std::array<unsigned_char,_16UL>,_unsigned_short> *in;
  char **extraout_RDX_07;
  char **extraout_RDX_08;
  char **extraout_RDX_09;
  char **extraout_RDX_10;
  char **ppcVar26;
  bool bVar27;
  peer_connection *ppVar28;
  int iVar29;
  long lVar30;
  bool bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  value_type v;
  bdecode_node p6f;
  bad_address_cast ex;
  char *in_2;
  bdecode_node pf;
  char *in_1;
  value_type v_3;
  char *in_3;
  bdecode_node pex_msg;
  error_code ec;
  undefined1 local_248 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_240;
  ulong local_230;
  long local_228;
  peers4_t *local_220;
  undefined1 local_218 [24];
  bdecode_token *local_200;
  char *pcStack_1f8;
  int local_1f0;
  int iStack_1ec;
  int iStack_1e8;
  int iStack_1e4;
  int local_1e0;
  char *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_1c0;
  bdecode_token *local_1b0;
  char *pcStack_1a8;
  int local_1a0;
  int iStack_19c;
  int iStack_198;
  int iStack_194;
  int local_190;
  peers4_t *local_180;
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  char *pcStack_138;
  int local_130;
  int iStack_12c;
  int iStack_128;
  int iStack_124;
  int local_120;
  error_code local_118;
  pointer local_108;
  bdecode_token *local_100;
  char *pcStack_f8;
  int local_f0;
  int iStack_ec;
  int iStack_e8;
  int iStack_e4;
  int local_e0;
  undefined1 local_d8 [8];
  anon_union_16_3_a3f0114d_for___in6_u aStack_d0;
  ulong local_c0;
  value_type local_b8;
  peers6_t *local_98;
  char *local_90;
  error_code local_88;
  pointer local_78;
  undefined4 uStack_70;
  undefined4 local_6c;
  undefined1 auStack_68 [12];
  int local_5c;
  int iStack_58;
  int iStack_54;
  int iStack_50;
  error_code local_40;
  undefined4 extraout_var;
  
  bVar31 = this->m_message_index != 0;
  bVar27 = bVar31 && msg == 1;
  if (!bVar31 || msg != 1) {
    return bVar27;
  }
  tVar17 = aux::torrent::flags(this->m_torrent);
  if (((uint)tVar17.m_val >> 0x15 & 1) != 0) {
    return bVar27;
  }
  if (0x7d000 < length) {
    ppVar28 = this->m_pc;
    local_88 = errors::make_error_code(pex_message_too_large);
    pp_Var18 = (ppVar28->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar25 = 2;
LAB_0039bf39:
    (*pp_Var18[0x14])(ppVar28,&local_88,1,uVar25);
    return bVar27;
  }
  if ((int)body.m_len < length) {
    return bVar27;
  }
  tVar19 = aux::time_now();
  if ((long)tVar19.__d.__r + -60000000000 < this->m_last_pex[0].__d.__r) {
    ppVar28 = this->m_pc;
    local_88 = errors::make_error_code(too_frequent_pex);
    pp_Var18 = (ppVar28->super_bandwidth_socket)._vptr_bandwidth_socket;
    uVar25 = 0;
    goto LAB_0039bf39;
  }
  rVar6 = this->m_last_pex[1].__d.__r;
  rVar7 = this->m_last_pex[2].__d.__r;
  rVar8 = this->m_last_pex[3].__d.__r;
  rVar9 = this->m_last_pex[4].__d.__r;
  this->m_last_pex[4].__d.__r = this->m_last_pex[5].__d.__r;
  this->m_last_pex[2].__d.__r = rVar8;
  this->m_last_pex[3].__d.__r = rVar9;
  this->m_last_pex[0].__d.__r = rVar6;
  this->m_last_pex[1].__d.__r = rVar7;
  this->m_last_pex[5].__d.__r = (rep)tVar19.__d.__r;
  auStack_68 = SUB1612((undefined1  [16])0x0,4);
  local_78 = (pointer)0x0;
  uStack_70 = 0;
  local_6c = 0;
  local_88.val_ = 0;
  local_88.failed_ = false;
  local_88._5_3_ = 0;
  local_88.cat_ = (error_category *)0x0;
  local_5c = -1;
  iStack_58 = -1;
  iStack_54 = -1;
  iStack_50 = -1;
  local_40.val_ = 0;
  local_40.failed_ = false;
  local_40.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  iVar14 = bdecode(body.m_ptr,body.m_ptr + body.m_len,(bdecode_node *)&local_88,&local_40,(int *)0x0
                   ,100,2000000);
  if ((iVar14 != 0) || (tVar15 = bdecode_node::type((bdecode_node *)&local_88), tVar15 != dict_t)) {
    ppVar28 = this->m_pc;
    local_118 = errors::make_error_code(invalid_pex_message);
    (*(ppVar28->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar28,&local_118,1,2);
    goto LAB_0039c284;
  }
  key._M_str = "dropped";
  key._M_len = 7;
  bdecode_node::dict_find_string((bdecode_node *)&local_118,(bdecode_node *)&local_88,key);
  bVar31 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_118);
  local_1d0 = 0;
  if (bVar31) {
    iVar14 = bdecode_node::string_length((bdecode_node *)&local_118);
    local_1d0 = (ulong)(uint)(iVar14 / 6);
  }
  bVar31 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_118);
  if (bVar31) {
    iVar14 = bdecode_node::string_length((bdecode_node *)&local_118);
    local_218._0_8_ = bdecode_node::string_ptr((bdecode_node *)&local_118);
    if (5 < iVar14) {
      iVar14 = iVar14 / 6;
      local_220 = &(this->super_ut_pex_peer_store).m_peers;
      ppcVar26 = extraout_RDX;
      do {
        aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)local_158,(aux *)local_218,ppcVar26);
        if (local_158._0_2_ != 2) {
          local_1c8 = (undefined1  [8])&PTR__bad_cast_004decf0;
          boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)local_1c8);
        }
        local_248._4_2_ = local_158._2_2_ << 8 | (ushort)local_158._2_2_ >> 8;
        local_248._0_4_ = local_158._4_4_;
        _Var20 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_248);
        ppcVar26 = extraout_RDX_00;
        if (((_Var20._M_current !=
              (this->super_ut_pex_peer_store).m_peers.
              super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            (*(int *)((_Var20._M_current)->first)._M_elems == local_248._0_4_)) &&
           ((_Var20._M_current)->second == local_248._4_2_)) {
          ::std::
          vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
          ::erase(local_220,(const_iterator)_Var20._M_current);
          ppcVar26 = extraout_RDX_01;
        }
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
  }
  key_00._M_str = "added";
  key_00._M_len = 5;
  bdecode_node::dict_find_string((bdecode_node *)local_158,(bdecode_node *)&local_88,key_00);
  pbVar11 = local_108;
  uVar25 = local_118._0_8_;
  local_118.cat_ = (error_category *)local_158._8_8_;
  local_118.val_ = local_158._0_4_;
  local_118.failed_ = (bool)local_158[4];
  local_118._5_3_ = local_158._5_3_;
  local_108 = (pointer)local_158._16_8_;
  local_158._0_8_ = (void *)0x0;
  local_158[8] = '\0';
  local_158[9] = '\0';
  local_158[10] = '\0';
  local_158[0xb] = '\0';
  local_158[0xc] = '\0';
  local_158[0xd] = '\0';
  local_158[0xe] = '\0';
  local_158[0xf] = '\0';
  local_158._16_8_ = (pointer)0x0;
  if ((pointer)uVar25 == (pointer)0x0) {
    local_e0 = local_120;
    local_f0 = local_130;
    iStack_ec = iStack_12c;
    iStack_e8 = iStack_128;
    iStack_e4 = iStack_124;
    local_100 = (bdecode_token *)local_158._24_8_;
    pcStack_f8 = pcStack_138;
  }
  else {
    operator_delete((void *)uVar25,(long)pbVar11 - uVar25);
    local_100 = (bdecode_token *)local_158._24_8_;
    pcStack_f8 = pcStack_138;
    local_f0 = local_130;
    iStack_ec = iStack_12c;
    iStack_e8 = iStack_128;
    iStack_e4 = iStack_124;
    local_e0 = local_120;
    if ((void *)local_158._0_8_ != (void *)0x0) {
      operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
    }
  }
  key_01._M_str = "added.f";
  key_01._M_len = 7;
  bdecode_node::dict_find_string((bdecode_node *)local_158,(bdecode_node *)&local_88,key_01);
  bVar31 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_118);
  local_220 = (peers4_t *)0x0;
  if (bVar31) {
    iVar14 = bdecode_node::string_length((bdecode_node *)&local_118);
    local_220 = (peers4_t *)(ulong)(uint)(iVar14 / 6);
  }
  bVar31 = bdecode_node::operator_cast_to_bool((bdecode_node *)&local_118);
  if ((bVar31) && (bVar31 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_158), bVar31))
  {
    iVar14 = bdecode_node::string_length((bdecode_node *)local_158);
    iVar16 = bdecode_node::string_length((bdecode_node *)&local_118);
    if (iVar14 != iVar16 / 6) goto LAB_0039c61b;
    iVar14 = bdecode_node::string_length((bdecode_node *)local_158);
    local_228 = CONCAT44(local_228._4_4_,iVar14);
    local_d8 = (undefined1  [8])bdecode_node::string_ptr((bdecode_node *)&local_118);
    local_1d8 = bdecode_node::string_ptr((bdecode_node *)local_158);
    if ((int)local_228 < 1) goto LAB_0039c61b;
    local_180 = &(this->super_ut_pex_peer_store).m_peers;
    lVar30 = 0;
    bVar31 = false;
    ppcVar26 = extraout_RDX_02;
    do {
      aux::read_v4_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                ((basic_endpoint<boost::asio::ip::tcp> *)local_248,(aux *)local_d8,ppcVar26);
      bVar1 = local_1d8[lVar30];
      ppVar2 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      ppVar3 = (this->super_ut_pex_peer_store).m_peers.
               super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      psVar21 = aux::torrent::settings(this->m_torrent);
      iVar14 = aux::session_settings::get_int(psVar21,0x404b);
      iVar29 = (int)((ulong)((long)ppVar2 - (long)ppVar3) >> 1);
      iVar16 = iVar29 * -0x55555555;
      if (iVar14 == iVar16 || SBORROW4(iVar14,iVar16) != iVar14 + iVar29 * 0x55555555 < 0) break;
      if (local_248._0_2_ != 2) {
        aStack_1c0 = aStack_240;
        local_1b0 = (bdecode_token *)(local_230 & 0xffffffff);
        local_1c8._4_4_ = 0;
      }
      else {
        aStack_1c0 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
        local_1b0 = (bdecode_token *)0x0;
        local_1c8._4_4_ = local_248._4_4_;
      }
      local_1c8._1_3_ = 0;
      local_1c8[0] = local_248._0_2_ != 2;
      bVar13 = aux::is_local((address *)local_1c8);
      if (bVar13) {
        iVar14 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
        psVar22 = (short *)CONCAT44(extraout_var,iVar14);
        if (*psVar22 != 2) {
          local_218._8_16_ = *(undefined1 (*) [16])(psVar22 + 4);
          local_200 = (bdecode_token *)(ulong)*(uint *)(psVar22 + 0xc);
          local_218._4_4_ = 0;
        }
        else {
          local_218._4_4_ = *(undefined4 *)(psVar22 + 2);
          local_218._8_16_ = (undefined1  [16])0x0;
          local_200 = (bdecode_token *)0x0;
        }
        local_218._1_3_ = 0;
        local_218[0] = *psVar22 != 2;
        bVar13 = aux::is_local((address *)local_218);
        ppcVar26 = extraout_RDX_03;
        if (bVar13) goto LAB_0039c529;
      }
      else {
LAB_0039c529:
        if (local_248._0_2_ != 2) {
          aStack_1c0 = aStack_240;
          local_1b0 = (bdecode_token *)(local_230 & 0xffffffff);
          local_1c8._4_4_ = 0;
        }
        else {
          aStack_1c0 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
          local_1b0 = (bdecode_token *)0x0;
          local_1c8._4_4_ = local_248._4_4_;
        }
        local_1c8._1_3_ = 0;
        local_1c8[0] = local_248._0_2_ != 2;
        boost::asio::ip::address::to_v4((address *)local_178);
        local_218._4_2_ = local_248._2_2_ << 8 | (ushort)local_248._2_2_ >> 8;
        local_218._0_4_ = local_178._0_4_;
        _Var20 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,4ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,4ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,4ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers.
                            super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_218);
        if (((_Var20._M_current ==
              (this->super_ut_pex_peer_store).m_peers.
              super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) ||
            (*&((_Var20._M_current)->first)._M_elems != (_Type)local_218._0_4_)) ||
           (ppcVar26 = extraout_RDX_04, (_Var20._M_current)->second != local_218._4_2_)) {
          ::std::
          vector<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
          ::insert(local_180,(const_iterator)_Var20._M_current,(value_type *)local_218);
          bVar31 = true;
          aux::torrent::add_peer
                    (this->m_torrent,(endpoint *)local_248,(peer_source_flags_t)0x4,
                     (pex_flags_t)(bVar1 & 0x7f));
          ppcVar26 = extraout_RDX_05;
        }
      }
      lVar30 = lVar30 + 1;
    } while ((int)local_228 != (int)lVar30);
  }
  else {
LAB_0039c61b:
    bVar31 = false;
  }
  key_02._M_str = "dropped6";
  key_02._M_len = 8;
  bdecode_node::dict_find_string((bdecode_node *)local_1c8,(bdecode_node *)&local_88,key_02);
  bVar13 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c8);
  if (bVar13) {
    iVar14 = bdecode_node::string_length((bdecode_node *)local_1c8);
    local_228 = CONCAT44(local_228._4_4_,iVar14);
    iVar14 = bdecode_node::string_length((bdecode_node *)local_1c8);
    local_178._0_8_ = bdecode_node::string_ptr((bdecode_node *)local_1c8);
    if (0x11 < iVar14) {
      iVar16 = 0;
      in = extraout_RDX_06;
      do {
        aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                  ((basic_endpoint<boost::asio::ip::tcp> *)local_218,(aux *)local_178,(char **)in);
        if (local_218._0_2_ == 2) {
          local_d8 = (undefined1  [8])&PTR__bad_cast_004decf0;
          boost::throw_exception<boost::asio::ip::bad_address_cast>((bad_address_cast *)local_d8);
        }
        local_248 = (undefined1  [8])local_218._8_8_;
        aStack_240.__u6_addr16[4] = local_218._2_2_ << 8 | (ushort)local_218._2_2_ >> 8;
        aStack_240._0_8_ = local_218._16_8_;
        _Var23 = ::std::
                 __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                           ((this->super_ut_pex_peer_store).m_peers6.
                            super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->super_ut_pex_peer_store).m_peers6.
                            super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,local_248);
        in = (this->super_ut_pex_peer_store).m_peers6.
             super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (_Var23._M_current != in) {
          auVar32[0] = -(((_Var23._M_current)->first)._M_elems[0] == local_248[0]);
          auVar32[1] = -(((_Var23._M_current)->first)._M_elems[1] == local_248[1]);
          auVar32[2] = -(((_Var23._M_current)->first)._M_elems[2] == local_248[2]);
          auVar32[3] = -(((_Var23._M_current)->first)._M_elems[3] == local_248[3]);
          auVar32[4] = -(((_Var23._M_current)->first)._M_elems[4] == local_248[4]);
          auVar32[5] = -(((_Var23._M_current)->first)._M_elems[5] == local_248[5]);
          auVar32[6] = -(((_Var23._M_current)->first)._M_elems[6] == local_248[6]);
          auVar32[7] = -(((_Var23._M_current)->first)._M_elems[7] == local_248[7]);
          auVar32[8] = -(((_Var23._M_current)->first)._M_elems[8] == aStack_240.__u6_addr8[0]);
          auVar32[9] = -(((_Var23._M_current)->first)._M_elems[9] == aStack_240.__u6_addr8[1]);
          auVar32[10] = -(((_Var23._M_current)->first)._M_elems[10] == aStack_240.__u6_addr8[2]);
          auVar32[0xb] = -(((_Var23._M_current)->first)._M_elems[0xb] == aStack_240.__u6_addr8[3]);
          auVar32[0xc] = -(((_Var23._M_current)->first)._M_elems[0xc] == aStack_240.__u6_addr8[4]);
          auVar32[0xd] = -(((_Var23._M_current)->first)._M_elems[0xd] == aStack_240.__u6_addr8[5]);
          auVar32[0xe] = -(((_Var23._M_current)->first)._M_elems[0xe] == aStack_240.__u6_addr8[6]);
          auVar32[0xf] = -(((_Var23._M_current)->first)._M_elems[0xf] == aStack_240.__u6_addr8[7]);
          if (((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar32[0xf] >> 7) << 0xf) == 0xffff) &&
             ((_Var23._M_current)->second == aStack_240.__u6_addr16[4])) {
            if ((_Var23._M_current + 1 != in) &&
               (uVar24 = (long)in - (long)(_Var23._M_current + 1), 0 < (long)uVar24)) {
              uVar24 = uVar24 / 0x12 + 1;
              do {
                uVar25 = *(undefined8 *)(_Var23._M_current[1].first._M_elems + 8);
                *(undefined8 *)((_Var23._M_current)->first)._M_elems =
                     *(undefined8 *)_Var23._M_current[1].first._M_elems;
                *(undefined8 *)(((_Var23._M_current)->first)._M_elems + 8) = uVar25;
                (_Var23._M_current)->second = _Var23._M_current[1].second;
                _Var23._M_current = _Var23._M_current + 1;
                uVar24 = uVar24 - 1;
              } while (1 < uVar24);
              in = (this->super_ut_pex_peer_store).m_peers6.
                   super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
            }
            in = in + -1;
            (this->super_ut_pex_peer_store).m_peers6.
            super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = in;
          }
        }
        iVar16 = iVar16 + 1;
      } while (iVar16 != iVar14 / 0x12);
    }
    local_1d0 = (ulong)(uint)((int)local_228 / 0x12 + (int)local_1d0);
  }
  key_03._M_str = "added6";
  key_03._M_len = 6;
  bdecode_node::dict_find_string((bdecode_node *)local_218,(bdecode_node *)&local_88,key_03);
  auVar10 = local_1c8;
  uVar25 = aStack_1c0._8_8_;
  local_1c8 = (undefined1  [8])local_218._0_8_;
  aStack_1c0 = (anon_union_16_3_a3f0114d_for___in6_u)local_218._8_16_;
  local_218._0_8_ = (pointer)0x0;
  local_218._8_16_ = ZEXT816(0);
  if ((bad_address_cast)auVar10 == (bad_address_cast)0x0) {
    local_190 = local_1e0;
    local_1a0 = local_1f0;
    iStack_19c = iStack_1ec;
    iStack_198 = iStack_1e8;
    iStack_194 = iStack_1e4;
    local_1b0 = local_200;
    pcStack_1a8 = pcStack_1f8;
  }
  else {
    operator_delete((void *)auVar10,uVar25 - (long)auVar10);
    local_1b0 = local_200;
    pcStack_1a8 = pcStack_1f8;
    local_1a0 = local_1f0;
    iStack_19c = iStack_1ec;
    iStack_198 = iStack_1e8;
    iStack_194 = iStack_1e4;
    local_190 = local_1e0;
    if ((pointer)local_218._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
    }
  }
  bVar13 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c8);
  if (bVar13) {
    iVar14 = bdecode_node::string_length((bdecode_node *)local_1c8);
    local_220 = (peers4_t *)(ulong)(uint)(iVar14 / 0x12 + (int)local_220);
  }
  key_04._M_str = "added6.f";
  key_04._M_len = 8;
  bdecode_node::dict_find_string((bdecode_node *)local_218,(bdecode_node *)&local_88,key_04);
  bVar13 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_1c8);
  if ((bVar13) && (bVar13 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_218), bVar13))
  {
    iVar14 = bdecode_node::string_length((bdecode_node *)local_218);
    iVar16 = bdecode_node::string_length((bdecode_node *)local_1c8);
    if (iVar14 == iVar16 / 0x12) {
      iVar14 = bdecode_node::string_length((bdecode_node *)local_218);
      local_1d8 = (char *)CONCAT44(local_1d8._4_4_,iVar14);
      local_90 = bdecode_node::string_ptr((bdecode_node *)local_1c8);
      local_180 = (peers4_t *)bdecode_node::string_ptr((bdecode_node *)local_218);
      if (0 < (int)local_1d8) {
        local_98 = &(this->super_ut_pex_peer_store).m_peers6;
        lVar30 = 0;
        ppcVar26 = extraout_RDX_07;
        do {
          aux::read_v6_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>,char_const*&>
                    ((basic_endpoint<boost::asio::ip::tcp> *)local_178,(aux *)&local_90,ppcVar26);
          bVar1 = *(byte *)((long)&(local_180->
                                   super__Vector_base<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_4UL>,_unsigned_short>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar30);
          if (local_178._0_2_ != 2) {
            aStack_240._8_8_ = local_178._16_8_;
            aStack_240._0_8_ = local_178._8_8_;
            local_230 = (ulong)(uint)local_178._24_4_;
            local_248._4_4_ = 0;
          }
          else {
            aStack_240 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
            local_230 = 0;
            local_248._4_4_ = local_178._4_4_;
          }
          local_248._1_3_ = 0;
          local_248[0] = local_178._0_2_ != 2;
          local_228 = lVar30;
          bVar13 = aux::is_local((address *)local_248);
          if (bVar13) {
            iVar14 = (*(this->m_pc->super_bandwidth_socket)._vptr_bandwidth_socket[0x10])();
            psVar22 = (short *)CONCAT44(extraout_var_00,iVar14);
            if (*psVar22 != 2) {
              aStack_d0 = *(anon_union_16_3_a3f0114d_for___in6_u *)(psVar22 + 4);
              local_c0 = (ulong)*(uint *)(psVar22 + 0xc);
              local_d8._4_4_ = 0;
            }
            else {
              local_d8._4_4_ = *(undefined4 *)(psVar22 + 2);
              aStack_d0 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
              local_c0 = 0;
            }
            local_d8._1_3_ = 0;
            local_d8[0] = *psVar22 != 2;
            bVar13 = aux::is_local((address *)local_d8);
            ppcVar26 = extraout_RDX_08;
            lVar30 = local_228;
            if (bVar13) goto LAB_0039ca9f;
          }
          else {
LAB_0039ca9f:
            ppVar4 = (this->super_ut_pex_peer_store).m_peers6.
                     super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            ppVar5 = (this->super_ut_pex_peer_store).m_peers6.
                     super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            psVar21 = aux::torrent::settings(this->m_torrent);
            iVar14 = aux::session_settings::get_int(psVar21,0x404b);
            iVar29 = (int)((ulong)((long)ppVar4 - (long)ppVar5) >> 1);
            iVar16 = iVar29 * 0x38e38e39;
            if (iVar14 == iVar16 || SBORROW4(iVar14,iVar16) != iVar14 + iVar29 * -0x38e38e39 < 0)
            break;
            if (local_178._0_2_ != 2) {
              aStack_240._8_8_ = local_178._16_8_;
              aStack_240._0_8_ = local_178._8_8_;
              local_230 = (ulong)(uint)local_178._24_4_;
              local_248._4_4_ = 0;
            }
            else {
              aStack_240 = (anon_union_16_3_a3f0114d_for___in6_u)0x0;
              local_230 = 0;
              local_248._4_4_ = local_178._4_4_;
            }
            local_248._1_3_ = 0;
            local_248[0] = local_178._0_2_ != 2;
            boost::asio::ip::address::to_v6((address_v6 *)local_d8,(address *)local_248);
            aVar12 = aStack_d0;
            local_b8.second = local_178._2_2_ << 8 | (ushort)local_178._2_2_ >> 8;
            local_b8.first._M_elems[0] = local_d8[0];
            local_b8.first._M_elems[1] = local_d8[1];
            local_b8.first._M_elems[2] = local_d8[2];
            local_b8.first._M_elems[3] = local_d8[3];
            local_b8.first._M_elems[4] = local_d8[4];
            local_b8.first._M_elems[5] = local_d8[5];
            local_b8.first._M_elems[6] = local_d8[6];
            local_b8.first._M_elems[7] = local_d8[7];
            local_b8.first._M_elems[8] = aStack_d0.__u6_addr8[0];
            local_b8.first._M_elems[9] = aStack_d0.__u6_addr8[1];
            local_b8.first._M_elems[10] = aStack_d0.__u6_addr8[2];
            local_b8.first._M_elems[0xb] = aStack_d0.__u6_addr8[3];
            local_b8.first._M_elems[0xc] = aStack_d0.__u6_addr8[4];
            local_b8.first._M_elems[0xd] = aStack_d0.__u6_addr8[5];
            local_b8.first._M_elems[0xe] = aStack_d0.__u6_addr8[6];
            local_b8.first._M_elems[0xf] = aStack_d0.__u6_addr8[7];
            aStack_d0 = aVar12;
            _Var23 = ::std::
                     __lower_bound<__gnu_cxx::__normal_iterator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>*,std::vector<std::pair<std::array<unsigned_char,16ul>,unsigned_short>,std::allocator<std::pair<std::array<unsigned_char,16ul>,unsigned_short>>>>,std::pair<std::array<unsigned_char,16ul>,unsigned_short>,__gnu_cxx::__ops::_Iter_less_val>
                               ((this->super_ut_pex_peer_store).m_peers6.
                                super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->super_ut_pex_peer_store).m_peers6.
                                super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&local_b8);
            lVar30 = local_228;
            if (_Var23._M_current !=
                (this->super_ut_pex_peer_store).m_peers6.
                super__Vector_base<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              auVar33[0] = -(((_Var23._M_current)->first)._M_elems[0] == local_b8.first._M_elems[0])
              ;
              auVar33[1] = -(((_Var23._M_current)->first)._M_elems[1] == local_b8.first._M_elems[1])
              ;
              auVar33[2] = -(((_Var23._M_current)->first)._M_elems[2] == local_b8.first._M_elems[2])
              ;
              auVar33[3] = -(((_Var23._M_current)->first)._M_elems[3] == local_b8.first._M_elems[3])
              ;
              auVar33[4] = -(((_Var23._M_current)->first)._M_elems[4] == local_b8.first._M_elems[4])
              ;
              auVar33[5] = -(((_Var23._M_current)->first)._M_elems[5] == local_b8.first._M_elems[5])
              ;
              auVar33[6] = -(((_Var23._M_current)->first)._M_elems[6] == local_b8.first._M_elems[6])
              ;
              auVar33[7] = -(((_Var23._M_current)->first)._M_elems[7] == local_b8.first._M_elems[7])
              ;
              auVar33[8] = -(((_Var23._M_current)->first)._M_elems[8] == local_b8.first._M_elems[8])
              ;
              auVar33[9] = -(((_Var23._M_current)->first)._M_elems[9] == local_b8.first._M_elems[9])
              ;
              auVar33[10] = -(((_Var23._M_current)->first)._M_elems[10] ==
                             local_b8.first._M_elems[10]);
              auVar33[0xb] = -(((_Var23._M_current)->first)._M_elems[0xb] ==
                              local_b8.first._M_elems[0xb]);
              auVar33[0xc] = -(((_Var23._M_current)->first)._M_elems[0xc] ==
                              local_b8.first._M_elems[0xc]);
              auVar33[0xd] = -(((_Var23._M_current)->first)._M_elems[0xd] ==
                              local_b8.first._M_elems[0xd]);
              auVar33[0xe] = -(((_Var23._M_current)->first)._M_elems[0xe] ==
                              local_b8.first._M_elems[0xe]);
              auVar33[0xf] = -(((_Var23._M_current)->first)._M_elems[0xf] ==
                              local_b8.first._M_elems[0xf]);
              if (((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar33[0xf] >> 7) << 0xf) == 0xffff) &&
                 (ppcVar26 = extraout_RDX_09, (_Var23._M_current)->second == local_b8.second))
              goto LAB_0039cbf1;
            }
            ::std::
            vector<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>,_std::allocator<std::pair<std::array<unsigned_char,_16UL>,_unsigned_short>_>_>
            ::insert(local_98,(const_iterator)_Var23._M_current,&local_b8);
            bVar31 = true;
            aux::torrent::add_peer
                      (this->m_torrent,(basic_endpoint<boost::asio::ip::tcp> *)local_178,
                       (peer_source_flags_t)0x4,(pex_flags_t)(bVar1 & 0x7f));
            ppcVar26 = extraout_RDX_10;
          }
LAB_0039cbf1:
          lVar30 = lVar30 + 1;
        } while ((int)local_1d8 != (int)lVar30);
      }
    }
  }
  aux::peer_connection::peer_log
            (this->m_pc,incoming_message,"PEX","dropped: %d added: %d",local_1d0,local_220);
  counters::inc_stats_counter(this->m_pc->m_counters,0x52,1);
  if (bVar31) {
    aux::torrent::do_connect_boost(this->m_torrent);
  }
  if ((pointer)local_218._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  if ((bad_address_cast)local_1c8 != (bad_address_cast)0x0) {
    operator_delete((void *)local_1c8,aStack_1c0._8_8_ - (long)local_1c8);
  }
  if ((void *)local_158._0_8_ != (void *)0x0) {
    operator_delete((void *)local_158._0_8_,local_158._16_8_ - local_158._0_8_);
  }
  if ((pointer)local_118._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_118._0_8_,(long)local_108 - local_118._0_8_);
  }
LAB_0039c284:
  if ((pointer)local_88._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_88._0_8_,(long)local_78 - local_88._0_8_);
  }
  return bVar27;
}

Assistant:

bool on_extended(int const length, int const msg, span<char const> body) override
		{
			if (msg != extension_index) return false;
			if (m_message_index == 0) return false;

			if (m_torrent.flags() & torrent_flags::disable_pex) return true;

			if (length > 500 * 1024)
			{
				m_pc.disconnect(errors::pex_message_too_large, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			if (int(body.size()) < length) return true;

			time_point const now = aux::time_now();
			if (now - seconds(60) <  m_last_pex[0])
			{
				// this client appears to be trying to flood us
				// with pex messages. Don't allow that.
				m_pc.disconnect(errors::too_frequent_pex, operation_t::bittorrent);
				return true;
			}

			int const num_pex_timers = sizeof(m_last_pex) / sizeof(m_last_pex[0]);
			for (int i = 0; i < num_pex_timers - 1; ++i)
				m_last_pex[i] = m_last_pex[i + 1];
			m_last_pex[num_pex_timers - 1] = now;

			bdecode_node pex_msg;
			error_code ec;
			int const ret = bdecode(body.begin(), body.end(), pex_msg, ec);
			if (ret != 0 || pex_msg.type() != bdecode_node::dict_t)
			{
				m_pc.disconnect(errors::invalid_pex_message, operation_t::bittorrent, peer_connection_interface::peer_error);
				return true;
			}

			bdecode_node p = pex_msg.dict_find_string("dropped");

#ifndef TORRENT_DISABLE_LOGGING
			int num_dropped = 0;
			int num_added = 0;
			if (p) num_dropped += p.string_length() / 6;
#endif
			if (p)
			{
				int const num_peers = p.string_length() / 6;
				char const* in = p.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					if (j != m_peers.end() && *j == v) m_peers.erase(j);
				}
			}

			p = pex_msg.dict_find_string("added");
			bdecode_node const pf = pex_msg.dict_find_string("added.f");

			bool peers_added = false;
#ifndef TORRENT_DISABLE_LOGGING
			if (p) num_added += p.string_length() / 6;
#endif
			if (p && pf && pf.string_length() == p.string_length() / 6)
			{
				int const num_peers = pf.string_length();
				char const* in = p.string_ptr();
				char const* fin = pf.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v4_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					if (int(m_peers.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;

					peers4_t::value_type const v(adr.address().to_v4().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers.begin(), m_peers.end(), v);
					// do we already know about this peer?
					if (j != m_peers.end() && *j == v) continue;
					m_peers.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}

			bdecode_node p6 = pex_msg.dict_find_string("dropped6");
			if (p6)
			{
#ifndef TORRENT_DISABLE_LOGGING
				num_dropped += p6.string_length() / 18;
#endif
				int const num_peers = p6.string_length() / 18;
				char const* in = p6.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					if (j != m_peers6.end() && *j == v) m_peers6.erase(j);
				}
			}

			p6 = pex_msg.dict_find_string("added6");
#ifndef TORRENT_DISABLE_LOGGING
			if (p6) num_added += p6.string_length() / 18;
#endif
			bdecode_node const p6f = pex_msg.dict_find_string("added6.f");
			if (p6 && p6f && p6f.string_length() == p6.string_length() / 18)
			{
				int const num_peers = p6f.string_length();
				char const* in = p6.string_ptr();
				char const* fin = p6f.string_ptr();

				for (int i = 0; i < num_peers; ++i)
				{
					auto const adr = aux::read_v6_endpoint<tcp::endpoint>(in);
					pex_flags_t flags(static_cast<std::uint8_t>(*fin++));

					// this is an internal flag. disregard it from the internet
					flags &= ~pex_lt_v2;

					// ignore local addresses unless the peer is local to us
					if (aux::is_local(adr.address()) && !aux::is_local(m_pc.remote().address())) continue;
					if (int(m_peers6.size()) >= m_torrent.settings().get_int(settings_pack::max_pex_peers))
						break;

					peers6_t::value_type const v(adr.address().to_v6().to_bytes(), adr.port());
					auto const j = std::lower_bound(m_peers6.begin(), m_peers6.end(), v);
					// do we already know about this peer?
					if (j != m_peers6.end() && *j == v) continue;
					m_peers6.insert(j, v);
					m_torrent.add_peer(adr, peer_info::pex, flags);
					peers_added = true;
				}
			}
#ifndef TORRENT_DISABLE_LOGGING
			m_pc.peer_log(peer_log_alert::incoming_message, "PEX", "dropped: %d added: %d"
				, num_dropped, num_added);
#endif

			m_pc.stats_counters().inc_stats_counter(counters::num_incoming_pex);

			if (peers_added) m_torrent.do_connect_boost();
			return true;
		}